

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaLoader::StoreAnimations(ColladaLoader *this,aiScene *pScene,ColladaParser *pParser)

{
  undefined1 auVar1 [16];
  pointer puVar2;
  bool bVar3;
  aiAnimation *paVar4;
  reference ppaVar5;
  aiAnimation *paVar6;
  size_type sVar7;
  aiNodeAnim **ppaVar8;
  reference pvVar9;
  ulong uVar10;
  _Base_ptr p_Var11;
  iterator __first;
  iterator __last;
  __normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
  local_510;
  __normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
  local_508;
  const_iterator local_500;
  aiAnimation *local_4f8;
  aiAnimation *srcAnimation;
  size_t b_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  aiString local_49c;
  aiAnimation *local_98;
  aiAnimation *combinedAnim;
  aiAnimation *other;
  size_t b;
  vector<unsigned_long,_std::allocator<unsigned_long>_> collectedAnimIndices;
  aiAnimation *templateAnim;
  size_t a;
  allocator local_41;
  string local_40;
  ColladaParser *local_20;
  ColladaParser *pParser_local;
  aiScene *pScene_local;
  ColladaLoader *this_local;
  
  local_20 = pParser;
  pParser_local = (ColladaParser *)pScene;
  pScene_local = (aiScene *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"",&local_41);
  StoreAnimations(this,pScene,pParser,&pParser->mAnims,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  for (templateAnim = (aiAnimation *)0x0;
      paVar4 = (aiAnimation *)
               std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size(&this->mAnims),
      templateAnim < paVar4; templateAnim = (aiAnimation *)((long)&(templateAnim->mName).length + 1)
      ) {
    ppaVar5 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::operator[]
                        (&this->mAnims,(size_type)templateAnim);
    collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*ppaVar5;
    if (((value_type)
        collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage)->mNumChannels == 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b);
      other = templateAnim;
      while( true ) {
        other = (aiAnimation *)((long)&(other->mName).length + 1);
        paVar4 = other;
        paVar6 = (aiAnimation *)
                 std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size(&this->mAnims);
        if (paVar6 <= paVar4) break;
        ppaVar5 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::operator[]
                            (&this->mAnims,(size_type)other);
        combinedAnim = *ppaVar5;
        if (combinedAnim->mNumChannels == 1) {
          if ((combinedAnim->mDuration ==
               (double)collectedAnimIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[0x81]) &&
             (!NAN(combinedAnim->mDuration) &&
              !NAN((double)collectedAnimIndices.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage[0x81]))) {
            if ((combinedAnim->mTicksPerSecond ==
                 (double)collectedAnimIndices.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[0x82]) &&
               (!NAN(combinedAnim->mTicksPerSecond) &&
                !NAN((double)collectedAnimIndices.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage[0x82]))) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b,
                         (value_type_conflict1 *)&other);
            }
          }
        }
      }
      bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b);
      if (!bVar3) {
        paVar4 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(paVar4);
        local_98 = paVar4;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_4e0,"combinedAnim_",(allocator *)((long)&b_1 + 7));
        std::operator+(&local_4c0,&local_4e0,(char)templateAnim + '0');
        aiString::aiString(&local_49c,&local_4c0);
        aiString::operator=(&local_98->mName,&local_49c);
        std::__cxx11::string::~string((string *)&local_4c0);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&b_1 + 7));
        local_98->mDuration =
             (double)collectedAnimIndices.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage[0x81];
        local_98->mTicksPerSecond =
             (double)collectedAnimIndices.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage[0x82];
        sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b);
        local_98->mNumChannels = (int)sVar7 + 1;
        ppaVar8 = (aiNodeAnim **)operator_new__((ulong)local_98->mNumChannels << 3);
        puVar2 = collectedAnimIndices.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        local_98->mChannels = ppaVar8;
        *local_98->mChannels =
             *(aiNodeAnim **)
              collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage[0x84];
        *(undefined8 *)
         collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage[0x84] = 0;
        if (collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          aiAnimation::~aiAnimation
                    ((aiAnimation *)
                     collectedAnimIndices.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
          operator_delete(puVar2);
        }
        paVar4 = local_98;
        ppaVar5 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::operator[]
                            (&this->mAnims,(size_type)templateAnim);
        *ppaVar5 = paVar4;
        for (srcAnimation = (aiAnimation *)0x0; paVar4 = srcAnimation,
            paVar6 = (aiAnimation *)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b),
            paVar4 < paVar6; srcAnimation = (aiAnimation *)((long)&(srcAnimation->mName).length + 1)
            ) {
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b,
                              (size_type)srcAnimation);
          ppaVar5 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::operator[]
                              (&this->mAnims,*pvVar9);
          paVar4 = *ppaVar5;
          local_98->mChannels[(long)((long)&(srcAnimation->mName).length + 1)] = *paVar4->mChannels;
          *paVar4->mChannels = (aiNodeAnim *)0x0;
          local_4f8 = paVar4;
          if (paVar4 != (aiAnimation *)0x0) {
            aiAnimation::~aiAnimation(paVar4);
            operator_delete(paVar4);
          }
        }
        while (bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b),
              ((bVar3 ^ 0xffU) & 1) != 0) {
          local_510._M_current =
               (aiAnimation **)
               std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::begin(&this->mAnims);
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b);
          local_508 = __gnu_cxx::
                      __normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
                      ::operator+(&local_510,*pvVar9);
          __gnu_cxx::
          __normal_iterator<aiAnimation*const*,std::vector<aiAnimation*,std::allocator<aiAnimation*>>>
          ::__normal_iterator<aiAnimation**>
                    ((__normal_iterator<aiAnimation*const*,std::vector<aiAnimation*,std::allocator<aiAnimation*>>>
                      *)&local_500,&local_508);
          std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::erase(&this->mAnims,local_500)
          ;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b);
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b);
    }
  }
  bVar3 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::empty(&this->mAnims);
  if (!bVar3) {
    sVar7 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size(&this->mAnims);
    (pParser_local->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (_Rb_tree_color)sVar7;
    sVar7 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size(&this->mAnims);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar7;
    uVar10 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    p_Var11 = (_Base_ptr)operator_new__(uVar10);
    (pParser_local->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var11;
    __first = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::begin(&this->mAnims);
    __last = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::end(&this->mAnims);
    std::
    copy<__gnu_cxx::__normal_iterator<aiAnimation**,std::vector<aiAnimation*,std::allocator<aiAnimation*>>>,aiAnimation**>
              ((__normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
                )__first._M_current,
               (__normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
                )__last._M_current,
               (aiAnimation **)
               (pParser_local->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
    ;
  }
  std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::clear(&this->mAnims);
  return;
}

Assistant:

void ColladaLoader::StoreAnimations( aiScene* pScene, const ColladaParser& pParser) {
    // recursively collect all animations from the collada scene
    StoreAnimations(pScene, pParser, &pParser.mAnims, "");

    // catch special case: many animations with the same length, each affecting only a single node.
    // we need to unite all those single-node-anims to a proper combined animation
    for( size_t a = 0; a < mAnims.size(); ++a) {
        aiAnimation* templateAnim = mAnims[a];
        if( templateAnim->mNumChannels == 1) {
            // search for other single-channel-anims with the same duration
            std::vector<size_t> collectedAnimIndices;
            for( size_t b = a+1; b < mAnims.size(); ++b) {
                aiAnimation* other = mAnims[b];
                if (other->mNumChannels == 1 && other->mDuration == templateAnim->mDuration &&
                    other->mTicksPerSecond == templateAnim->mTicksPerSecond)
                    collectedAnimIndices.push_back(b);
            }

            // if there are other animations which fit the template anim, combine all channels into a single anim
            if (!collectedAnimIndices.empty())
            {
                aiAnimation* combinedAnim = new aiAnimation();
                combinedAnim->mName = aiString(std::string("combinedAnim_") + char('0' + a));
                combinedAnim->mDuration = templateAnim->mDuration;
                combinedAnim->mTicksPerSecond = templateAnim->mTicksPerSecond;
                combinedAnim->mNumChannels = static_cast<unsigned int>(collectedAnimIndices.size() + 1);
                combinedAnim->mChannels = new aiNodeAnim*[combinedAnim->mNumChannels];
                // add the template anim as first channel by moving its aiNodeAnim to the combined animation
                combinedAnim->mChannels[0] = templateAnim->mChannels[0];
                templateAnim->mChannels[0] = NULL;
                delete templateAnim;
                // combined animation replaces template animation in the anim array
                mAnims[a] = combinedAnim;

                // move the memory of all other anims to the combined anim and erase them from the source anims
                for (size_t b = 0; b < collectedAnimIndices.size(); ++b)
                {
                    aiAnimation* srcAnimation = mAnims[collectedAnimIndices[b]];
                    combinedAnim->mChannels[1 + b] = srcAnimation->mChannels[0];
                    srcAnimation->mChannels[0] = NULL;
                    delete srcAnimation;
                }

                // in a second go, delete all the single-channel-anims that we've stripped from their channels
                // back to front to preserve indices - you know, removing an element from a vector moves all elements behind the removed one
                while (!collectedAnimIndices.empty())
                {
                    mAnims.erase(mAnims.begin() + collectedAnimIndices.back());
                    collectedAnimIndices.pop_back();
                }
            }
        }
    }

    // now store all anims in the scene
    if (!mAnims.empty())
    {
        pScene->mNumAnimations = static_cast<unsigned int>(mAnims.size());
        pScene->mAnimations = new aiAnimation*[mAnims.size()];
        std::copy(mAnims.begin(), mAnims.end(), pScene->mAnimations);
    }

    mAnims.clear();
}